

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ColorConvertRGBtoHSV(float r,float g,float b,float *out_h,float *out_s,float *out_v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar5 = g;
  fVar1 = b;
  if (b <= g) {
    fVar5 = b;
    fVar1 = g;
  }
  fVar3 = (float)(-(uint)(g < b) & 0xbf800000);
  fVar6 = r;
  fVar2 = fVar1;
  if (fVar1 <= r) {
    fVar6 = fVar1;
    fVar2 = r;
  }
  fVar4 = fVar6;
  if (fVar5 <= fVar6) {
    fVar4 = fVar5;
  }
  *out_h = ABS((fVar6 - fVar5) / ((fVar2 - fVar4) * 6.0 + 1e-20) +
               (float)(-(uint)(r < fVar1) & (uint)(-0.33333334 - fVar3) |
                      ~-(uint)(r < fVar1) & (uint)fVar3));
  *out_s = (fVar2 - fVar4) / (fVar2 + 1e-20);
  *out_v = fVar2;
  return;
}

Assistant:

void ImGui::ColorConvertRGBtoHSV(float r, float g, float b, float& out_h, float& out_s, float& out_v)
{
    float K = 0.f;
    if (g < b)
    {
        ImSwap(g, b);
        K = -1.f;
    }
    if (r < g)
    {
        ImSwap(r, g);
        K = -2.f / 6.f - K;
    }

    const float chroma = r - (g < b ? g : b);
    out_h = ImFabs(K + (g - b) / (6.f * chroma + 1e-20f));
    out_s = chroma / (r + 1e-20f);
    out_v = r;
}